

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

_Bool mon_take_hit(monster *mon,player *p,wchar_t dam,_Bool *fear,char *note)

{
  _Bool _Var1;
  char *note_local;
  _Bool *fear_local;
  wchar_t dam_local;
  player *p_local;
  monster *mon_local;
  
  if (p->upkeep->health_who == mon) {
    p->upkeep->redraw = p->upkeep->redraw | 0x200;
  }
  if (dam <= mon->hp) {
    monster_wake(mon,false,L'd');
    mon_clear_timed(mon,L'\x06',L'\x01');
  }
  _Var1 = monster_is_camouflaged(mon);
  if (_Var1) {
    become_aware((chunk *)cave,mon);
  }
  if (dam == L'\0') {
    mon_local._7_1_ = false;
  }
  else {
    p->timed[0x2e] = 0;
    mon->hp = mon->hp - (short)dam;
    if (mon->hp < 0) {
      if ((p->upkeep->arena_level & 1U) == 0) {
        player_kill_monster(mon,p,note);
        *fear = false;
        mon_local._7_1_ = true;
      }
      else {
        p->upkeep->generate_level = true;
        p->upkeep->health_who = mon;
        *fear = false;
        mon_local._7_1_ = true;
      }
    }
    else {
      _Var1 = monster_scared_by_damage(mon,dam);
      *fear = _Var1;
      mon_local._7_1_ = false;
    }
  }
  return mon_local._7_1_;
}

Assistant:

bool mon_take_hit(struct monster *mon, struct player *p, int dam, bool *fear,
		const char *note)
{
	/* Redraw (later) if needed */
	if (p->upkeep->health_who == mon)
		p->upkeep->redraw |= (PR_HEALTH);

	/* If the hit doesn't kill, wake it up, make it aware of the player */
	if (dam <= mon->hp) {
		monster_wake(mon, false, 100);
		mon_clear_timed(mon, MON_TMD_HOLD, MON_TMD_FLG_NOTIFY);
	}

	/* Become aware of its presence */
	if (monster_is_camouflaged(mon))
		become_aware(cave, mon);

	/* No damage, we're done */
	if (dam == 0) return false;

	/* Covering tracks is no longer possible */
	p->timed[TMD_COVERTRACKS] = 0;

	/* Hurt it */
	mon->hp -= dam;
	if (mon->hp < 0) {
		/* Deal with arena monsters */
		if (p->upkeep->arena_level) {
			p->upkeep->generate_level = true;
			p->upkeep->health_who = mon;
			(*fear) = false;
			return true;
		}

		/* It is dead now */
		player_kill_monster(mon, p, note);

		/* Not afraid */
		(*fear) = false;

		/* Monster is dead */
		return true;
	} else {
		/* Did it get frightened? */
		(*fear) = monster_scared_by_damage(mon, dam);

		/* Not dead yet */
		return false;
	}
}